

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall
ON_ObjectRenderingAttributes::Read(ON_ObjectRenderingAttributes *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  int minor_version;
  bool b;
  int major_version;
  int local_34;
  bool local_2d;
  int local_2c;
  
  bVar2 = false;
  ON_ClassArray<ON_MaterialRef>::SetCapacity((ON_ClassArray<ON_MaterialRef> *)this,0);
  ON_ClassArray<ON_MappingRef>::SetCapacity(&this->m_mappings,0);
  this->m_bCastsShadows = true;
  this->m_bReceivesShadows = true;
  this->m_bits = '\0';
  this->m_reserved1 = '\0';
  local_2c = 0;
  local_34 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,&local_2c,&local_34);
  if (bVar1) {
    bVar1 = 0 < local_34 && local_2c == 1;
    if ((((0 < local_34 && local_2c == 1) &&
         (bVar1 = ON_BinaryArchive::ReadArray(archive,(ON_ClassArray<ON_MaterialRef> *)this), bVar1)
         ) && (bVar1 = ON_BinaryArchive::ReadArray(archive,&this->m_mappings), bVar1)) &&
       (((1 < local_34 &&
         (bVar1 = ON_BinaryArchive::ReadBool(archive,&this->m_bCastsShadows), bVar1)) &&
        ((bVar1 = ON_BinaryArchive::ReadBool(archive,&this->m_bReceivesShadows), bVar1 &&
         (2 < local_34)))))) {
      local_2d = (bool)(this->m_bits & 1);
      bVar1 = ON_BinaryArchive::ReadBool(archive,&local_2d);
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(archive);
    bVar2 = (bool)(bVar2 & bVar1);
  }
  return bVar2;
}

Assistant:

bool ON_ObjectRenderingAttributes::Read( ON_BinaryArchive& archive )
{
  Default();
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk( TCODE_ANONYMOUS_CHUNK, &major_version, &minor_version );
  if (!rc)
    return false;
  for(;;)
  {
    rc = ( 1 == major_version && minor_version >= 1 );
    if (!rc) break;

    // DO NOT CALL ON_RenderingAttributes::Read
    if (rc) rc = archive.ReadArray(m_materials);
    if (!rc) break;
    if (rc) rc = archive.ReadArray(m_mappings);
    if (!rc) break;

    if ( minor_version <= 1 )
      break;

    // version 1.2 fields added 20061129
    rc = archive.ReadBool(&m_bCastsShadows);
    if ( !rc ) break;
    rc = archive.ReadBool(&m_bReceivesShadows);
    if ( !rc ) break;

    if ( minor_version <= 2 )
      break;

    // version 1.3 fields added 20101019
    bool b = AdvancedTexturePreview();
    rc = archive.ReadBool(&b);
    if ( !rc ) break;
    // Jussi 20120430: We don't want to enable advanced texture preview by default. It will be
    //                 turned on when needed (depending on active render plug-in etc).
    //EnableAdvancedTexturePreview(b);

    break;
  }
  if ( !archive.EndRead3dmChunk() )
    rc = false;

  return rc;
}